

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O2

wchar_t tar_read_header(archive_read *a,tar *tar,archive_entry *entry,size_t *unconsumed)

{
  archive_string *as;
  char cVar1;
  wchar_t wVar2;
  int iVar3;
  wchar_t wVar4;
  archive_read *a_00;
  char *pcVar5;
  int64_t iVar6;
  dev_t dVar7;
  wchar_t *pwVar8;
  wchar_t *pwVar9;
  wchar_t *pwVar10;
  char *pcVar11;
  size_t min;
  int64_t remaining_00;
  ulong uVar12;
  gnu_sparse *sparse;
  archive_string_conv *paVar13;
  archive_acl *acl;
  int *piVar14;
  long lVar15;
  uint uVar16;
  void *pvVar17;
  ulong request;
  char *pcVar18;
  size_t *in_R8;
  long lVar19;
  bool bVar20;
  ulong uStack_60;
  int64_t remaining;
  ssize_t bytes;
  
  do {
    tar_flush_unconsumed(a,unconsumed);
    pvVar17 = (void *)0x200;
    a_00 = (archive_read *)__archive_read_ahead(a,0x200,&bytes);
    if (bytes < 0) goto LAB_00151ddb;
    if (bytes == 0) goto LAB_00151d52;
    if ((ulong)bytes < 0x200) {
      pcVar5 = "Truncated tar archive";
      goto LAB_00151da7;
    }
    *unconsumed = 0x200;
    if (((char)(a_00->archive).magic != '\0') ||
       (wVar2 = archive_block_is_null((char *)a_00), wVar2 == L'\0')) {
      wVar2 = checksum(a_00,pvVar17);
      if (wVar2 == L'\0') {
        tar_flush_unconsumed(a,unconsumed);
        archive_set_error(&a->archive,0x16,"Damaged tar archive");
        uStack_60 = 0xfffffffffffffff6;
        bytes = uStack_60;
        goto LAB_00151ddb;
      }
      iVar3 = tar->header_recursion_depth;
      tar->header_recursion_depth = iVar3 + 1;
      if (0x1f < iVar3) {
        tar_flush_unconsumed(a,unconsumed);
        pcVar5 = "Too many special headers";
        iVar3 = 0x16;
        goto LAB_00151d8f;
      }
      cVar1 = a_00->field_0x9c;
      if (cVar1 == 'x') {
        (a->archive).archive_format = 0x30002;
        (a->archive).archive_format_name = "POSIX pax interchange format";
LAB_00151f99:
        wVar2 = header_pax_extensions(a,tar,entry,a_00,unconsumed);
        goto LAB_001520ba;
      }
      if (cVar1 == 'K') {
        wVar2 = read_body_to_string(a,(tar *)&tar->longlink,(archive_string *)a_00,unconsumed,in_R8)
        ;
        if ((wVar2 != L'\0') ||
           ((wVar2 = tar_read_header(a,tar,entry,unconsumed), wVar2 != L'\0' &&
            (wVar2 != L'\xffffffec')))) goto LAB_001520ba;
        archive_entry_copy_link(entry,(tar->longlink).s);
        wVar2 = L'\0';
        goto LAB_001524bc;
      }
      if (cVar1 == 'L') {
        wVar2 = read_body_to_string(a,(tar *)&tar->longname,(archive_string *)a_00,unconsumed,in_R8)
        ;
        if (wVar2 == L'\0') {
          wVar2 = tar_read_header(a,tar,entry,unconsumed);
          if ((wVar2 != L'\0') && (wVar2 != L'\xffffffec')) goto LAB_001520ba;
          wVar4 = _archive_entry_copy_pathname_l
                            (entry,(tar->longname).s,(tar->longname).length,tar->sconv);
          if (wVar4 == L'\0') {
            bVar20 = true;
            goto LAB_001520c7;
          }
          wVar2 = set_conversion_failed_error(a,tar->sconv,"Pathname");
          goto LAB_001520ba;
        }
      }
      else {
        if (cVar1 == 'V') {
          wVar2 = tar_read_header(a,tar,entry,unconsumed);
          bVar20 = wVar2 != L'\x01';
          goto LAB_001520bd;
        }
        if (cVar1 == 'X') {
          (a->archive).archive_format = 0x30002;
          (a->archive).archive_format_name = "POSIX pax interchange format (Sun variant)";
          goto LAB_00151f99;
        }
        if (cVar1 == 'g') {
          (a->archive).archive_format = 0x30002;
          (a->archive).archive_format_name = "POSIX pax interchange format";
          wVar2 = read_body_to_string(a,(tar *)&tar->pax_global,(archive_string *)a_00,unconsumed,
                                      in_R8);
          if (wVar2 == L'\0') {
            wVar2 = tar_read_header(a,tar,entry,unconsumed);
            if (wVar2 == L'\x01') goto LAB_00151d52;
            goto LAB_001520ba;
          }
        }
        else {
          if (cVar1 != 'A') {
            if (*(long *)((long)&a_00->bidders[0].name + 1) == 0x20207261747375) {
              (a->archive).archive_format = 0x30004;
              (a->archive).archive_format_name = "GNU tar format";
              wVar2 = header_common(a,tar,entry,a_00);
              if ((((wVar2 == L'\xffffffe2') ||
                   ((wVar4 = _archive_entry_copy_pathname_l(entry,(char *)a_00,100,tar->sconv),
                    wVar4 != L'\0' &&
                    (wVar2 = set_conversion_failed_error(a,tar->sconv,"Pathname"),
                    wVar2 == L'\xffffffe2')))) ||
                  ((wVar4 = _archive_entry_copy_uname_l
                                      (entry,(char *)((long)&a_00->bidders[0].vtable + 1),0x20,
                                       tar->sconv), wVar4 != L'\0' &&
                   (wVar2 = set_conversion_failed_error(a,tar->sconv,"Uname"),
                   wVar2 == L'\xffffffe2')))) ||
                 ((wVar4 = _archive_entry_copy_gname_l
                                     (entry,(char *)((long)&a_00->bidders[2].data + 1),0x20,
                                      tar->sconv), wVar4 != L'\0' &&
                  (wVar2 = set_conversion_failed_error(a,tar->sconv,"Gname"), wVar2 == L'\xffffffe2'
                  )))) goto LAB_00151db4;
              if ((byte)(a_00->field_0x9c - 0x33) < 2) {
                dVar7 = tar_atol((char *)((long)&a_00->bidders[3].name + 1),8);
                archive_entry_set_rdevmajor(entry,dVar7);
                dVar7 = tar_atol((char *)((long)&a_00->bidders[3].vtable + 1),8);
                archive_entry_set_rdevminor(entry,dVar7);
              }
              else {
                archive_entry_set_rdev(entry,0);
              }
              tar->entry_padding = (ulong)(-(int)tar->entry_bytes_remaining & 0x1ff);
              iVar6 = tar_atol((char *)((long)&a_00->bidders[4].data + 1),0xc);
              if (0 < iVar6) {
                archive_entry_set_atime(entry,iVar6,0);
              }
              iVar6 = tar_atol((char *)((long)&a_00->bidders[4].name + 5),0xc);
              if (0 < iVar6) {
                archive_entry_set_ctime(entry,iVar6,0);
              }
              if (*(char *)((long)&a_00->bidders[9].vtable + 3) != '\0') {
                iVar6 = tar_atol((char *)((long)&a_00->bidders[9].vtable + 3),0xc);
                tar->realsize = iVar6;
                archive_entry_set_size(entry,iVar6);
                tar->realsize_override = 1;
              }
              if (*(char *)((long)&a_00->bidders[5].vtable + 2) != '\0') {
                wVar4 = gnu_sparse_old_parse
                                  (a,tar,(gnu_sparse *)((long)&a_00->bidders[5].vtable + 2),L'\x04')
                ;
                if (wVar4 != L'\0') goto LAB_00151db4;
                if (*(char *)((long)&a_00->bidders[9].vtable + 2) == '\0') goto LAB_001528f1;
                goto LAB_00152878;
              }
            }
            else {
              iVar3 = bcmp((void *)((long)&a_00->bidders[0].name + 1),"ustar",5);
              if (iVar3 != 0) {
                (a->archive).archive_format = 0x30000;
                (a->archive).archive_format_name = "tar (non-POSIX)";
                wVar2 = _archive_entry_copy_pathname_l(entry,(char *)a_00,100,tar->sconv);
                wVar4 = L'\0';
                if ((wVar2 != L'\0') &&
                   (wVar4 = set_conversion_failed_error(a,tar->sconv,"Pathname"),
                   wVar4 == L'\xffffffe2')) goto LAB_00151db4;
                wVar2 = header_common(a,tar,entry,a_00);
                if (wVar4 < wVar2) {
                  wVar2 = wVar4;
                }
                tar->entry_padding = (ulong)(-(int)tar->entry_bytes_remaining & 0x1ff);
                bVar20 = true;
                goto LAB_001520bd;
              }
              if ((a->archive).archive_format != 0x30002) {
                (a->archive).archive_format = 0x30001;
                (a->archive).archive_format_name = "POSIX ustar format";
              }
              as = &tar->entry_pathname;
              cVar1 = *(char *)((long)&a_00->bidders[4].data + 1);
              (tar->entry_pathname).length = 0;
              if ((cVar1 != '\0') &&
                 (archive_strncat(as,(void *)((long)&a_00->bidders[4].data + 1),0x9b),
                 (tar->entry_pathname).s[(tar->entry_pathname).length - 1] != '/')) {
                archive_strappend_char(as,'/');
              }
              archive_strncat(as,a_00,100);
              wVar2 = _archive_entry_copy_pathname_l
                                (entry,(tar->entry_pathname).s,(tar->entry_pathname).length,
                                 tar->sconv);
              if (wVar2 == L'\0') {
                wVar2 = L'\0';
              }
              else {
                wVar2 = set_conversion_failed_error(a,tar->sconv,"Pathname");
                if (wVar2 == L'\xffffffe2') goto LAB_00151db4;
              }
              wVar4 = header_common(a,tar,entry,a_00);
              if (wVar4 == L'\xffffffe2') goto LAB_00151db4;
              if (wVar4 < wVar2) {
                wVar2 = wVar4;
              }
              wVar4 = _archive_entry_copy_uname_l
                                (entry,(char *)((long)&a_00->bidders[0].vtable + 1),0x20,tar->sconv)
              ;
              if (((wVar4 != L'\0') &&
                  (wVar2 = set_conversion_failed_error(a,tar->sconv,"Uname"), wVar2 == L'\xffffffe2'
                  )) || ((wVar4 = _archive_entry_copy_gname_l
                                            (entry,(char *)((long)&a_00->bidders[2].data + 1),0x20,
                                             tar->sconv), wVar4 != L'\0' &&
                         (wVar2 = set_conversion_failed_error(a,tar->sconv,"Gname"),
                         wVar2 == L'\xffffffe2')))) goto LAB_00151db4;
              if ((byte)(a_00->field_0x9c - 0x33) < 2) {
                dVar7 = tar_atol((char *)((long)&a_00->bidders[3].name + 1),8);
                archive_entry_set_rdevmajor(entry,dVar7);
                dVar7 = tar_atol((char *)((long)&a_00->bidders[3].vtable + 1),8);
                archive_entry_set_rdevminor(entry,dVar7);
              }
              tar->entry_padding = (ulong)(-(int)tar->entry_bytes_remaining & 0x1ff);
            }
            bVar20 = true;
            goto LAB_001520c7;
          }
          (a->archive).archive_format = 0x30002;
          (a->archive).archive_format_name = "Solaris tar";
          iVar6 = tar_atol((char *)((long)&(a_00->archive).read_data_remaining + 4),0xc);
          wVar2 = read_body_to_string(a,tar,(archive_string *)a_00,unconsumed,in_R8);
          if (wVar2 == L'\0') {
            wVar2 = tar_read_header(a,tar,entry,unconsumed);
            if ((wVar2 != L'\0') && (wVar2 != L'\xffffffec')) goto LAB_001520ba;
            wVar2 = L'\xffffffec';
            pcVar5 = (tar->acl_text).s;
            pcVar18 = pcVar5 + iVar6;
            lVar19 = 0;
            goto LAB_00151eb8;
          }
        }
      }
      bVar20 = true;
      goto LAB_001520bd;
    }
    if ((a->archive).archive_format_name == (char *)0x0) {
      (a->archive).archive_format = 0x30000;
      (a->archive).archive_format_name = "tar";
    }
  } while (tar->read_concatenated_archives != 0);
  tar_flush_unconsumed(a,unconsumed);
  pcVar5 = (char *)__archive_read_ahead(a,0x200,(ssize_t *)0x0);
  if (((pcVar5 != (char *)0x0) && (*pcVar5 == '\0')) &&
     (wVar2 = archive_block_is_null(pcVar5), wVar2 != L'\0')) {
    __archive_read_consume(a,0x200);
  }
  archive_clear_error(&a->archive);
LAB_00151d52:
  uStack_60 = 1;
  bytes = uStack_60;
  goto LAB_00151ddb;
LAB_00152878:
  tar_flush_unconsumed(a,unconsumed);
  sparse = (gnu_sparse *)__archive_read_ahead(a,0x200,&remaining);
  if (-1 < remaining) {
    if ((ulong)remaining < 0x200) {
      pcVar5 = "Truncated tar archive detected while reading sparse file data";
LAB_00151da7:
      iVar3 = 0x54;
      goto LAB_00151da9;
    }
    *unconsumed = 0x200;
    wVar4 = gnu_sparse_old_parse(a,tar,sparse,L'\x15');
    if (wVar4 == L'\0') goto code_r0x001528d1;
  }
  goto LAB_00151db4;
code_r0x001528d1:
  if (sparse[0x15].offset[0] == '\0') goto code_r0x001528da;
  goto LAB_00152878;
LAB_00151eb8:
  cVar1 = *pcVar5;
  if ((cVar1 == '\0') || (pcVar18 <= pcVar5)) goto LAB_00152474;
  if ((byte)(cVar1 - 0x38U) < 0xf8) {
    pcVar5 = "Malformed Solaris ACL attribute (invalid digit)";
LAB_001524af:
    archive_set_error(&a->archive,-1,pcVar5);
    goto LAB_001524bc;
  }
  lVar19 = (ulong)(byte)(cVar1 - 0x30) + lVar19 * 8;
  if (0xffffff < lVar19) {
    pcVar5 = "Malformed Solaris ACL attribute (count too large)";
    goto LAB_001524af;
  }
  pcVar5 = pcVar5 + 1;
  goto LAB_00151eb8;
LAB_00152474:
  uVar16 = (uint)lVar19 & 0xfffc0000;
  if (uVar16 == 0x40000) {
    wVar2 = L'Ā';
LAB_00152912:
    if (pcVar5 + 1 < pcVar18) {
      lVar19 = 1;
      do {
        lVar15 = lVar19;
        if (pcVar5[lVar15] == '\0') break;
        lVar19 = lVar15 + 1;
      } while (pcVar5 + lVar15 < pcVar18);
      if (tar->sconv_acl == (archive_string_conv *)0x0) {
        paVar13 = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
        tar->sconv_acl = paVar13;
        if (paVar13 != (archive_string_conv *)0x0) goto LAB_00152963;
        goto LAB_00151db4;
      }
LAB_00152963:
      (tar->localname).length = 0;
      archive_strncat(&tar->localname,pcVar5 + 1,lVar15 - 1);
      acl = archive_entry_acl(entry);
      wVar2 = archive_acl_from_text_l(acl,(tar->localname).s,wVar2,tar->sconv_acl);
      if (wVar2 != L'\0') {
        piVar14 = __errno_location();
        if (*piVar14 == 0xc) {
          pcVar5 = "Can\'t allocate memory for ACL";
          iVar3 = 0xc;
        }
        else {
          pcVar5 = "Malformed Solaris ACL attribute (unparsable)";
          iVar3 = -1;
        }
        archive_set_error(&a->archive,iVar3,pcVar5);
LAB_001520ba:
        bVar20 = true;
        goto LAB_001520bd;
      }
      wVar2 = L'\0';
    }
    else {
      archive_set_error(&a->archive,-1,"Malformed Solaris ACL attribute (body overflow)");
      wVar2 = L'\xffffffec';
    }
  }
  else {
    if (uVar16 == 0xc0000) {
      wVar2 = L'㰀';
      goto LAB_00152912;
    }
    archive_set_error(&a->archive,-1,"Malformed Solaris ACL attribute (unsupported type %o)");
  }
LAB_001524bc:
  tar_flush_unconsumed(a,unconsumed);
  iVar3 = tar->header_recursion_depth + -1;
  tar->header_recursion_depth = iVar3;
  bVar20 = true;
LAB_001524da:
  if ((iVar3 == 0) && (tar->process_mac_extensions != 0)) {
    pwVar8 = archive_entry_pathname_w(entry);
    pwVar10 = pwVar8;
    if (pwVar8 == (wchar_t *)0x0) {
      pcVar5 = archive_entry_pathname(entry);
      pcVar18 = pcVar5;
      if (pcVar5 == (char *)0x0) {
        wVar4 = L'\xffffffe7';
      }
      else {
        do {
          while( true ) {
            pcVar11 = pcVar18 + 1;
            cVar1 = *pcVar18;
            pcVar18 = pcVar11;
            if (cVar1 != '/') break;
            if (*pcVar11 != '\0') {
              pcVar5 = pcVar11;
            }
          }
        } while (cVar1 != '\0');
        wVar4 = L'\0';
        if (((*pcVar5 == '.') && (pcVar5[1] == '_')) && (pcVar5[2] != '\0')) goto LAB_001525a4;
      }
    }
    else {
      do {
        while( true ) {
          pwVar9 = pwVar10 + 1;
          wVar4 = *pwVar10;
          pwVar10 = pwVar9;
          if (wVar4 != L'/') break;
          if (*pwVar9 != L'\0') {
            pwVar8 = pwVar9;
          }
        }
      } while (wVar4 != L'\0');
      wVar4 = L'\0';
      if (((*pwVar8 == L'.') && (pwVar8[1] == L'_')) && (pwVar8[2] != L'\0')) {
LAB_001525a4:
        min = archive_entry_size(entry);
        if (((long)min < 0) ||
           (pvVar17 = __archive_read_ahead(a,min,(ssize_t *)0x0), pvVar17 == (void *)0x0)) {
          *unconsumed = 0;
          wVar4 = L'\xffffffe2';
        }
        else {
          archive_entry_copy_mac_metadata(entry,pvVar17,min);
          *unconsumed = min + 0x1ff & 0xfffffffffffffe00;
          tar_flush_unconsumed(a,unconsumed);
          wVar4 = tar_read_header(a,tar,entry,unconsumed);
        }
      }
    }
    if (wVar4 < wVar2) {
      wVar2 = wVar4;
    }
  }
LAB_00152639:
  bytes = 1;
  if (wVar2 != L'\xffffffec') {
    if (wVar2 == L'\x01') {
      if (!bVar20) goto LAB_00151ddb;
      pcVar5 = "Damaged tar archive";
      iVar3 = 0x16;
LAB_00151da9:
      archive_set_error(&a->archive,iVar3,pcVar5);
      goto LAB_00151db4;
    }
    bytes = 0xffffffffffffffe2;
    if (wVar2 != L'\0') goto LAB_00151ddb;
  }
  if (tar->sparse_gnu_pending == '\0') {
    bytes = (ssize_t)(uint)wVar2;
  }
  else if ((tar->sparse_gnu_major == 1) && (tar->sparse_gnu_minor == 0)) {
    tar->sparse_gnu_pending = '\0';
    gnu_clear_sparse_list(tar);
    remaining = tar->entry_bytes_remaining;
    iVar6 = gnu_sparse_10_atol(a,tar,&remaining,unconsumed);
    if (-1 < (int)iVar6) {
      iVar3 = (int)iVar6 + 1;
      while (iVar3 = iVar3 + -1, 0 < iVar3) {
        iVar6 = gnu_sparse_10_atol(a,tar,&remaining,unconsumed);
        if (((iVar6 < 0) ||
            (remaining_00 = gnu_sparse_10_atol(a,tar,&remaining,unconsumed), remaining_00 < 0)) ||
           (wVar4 = gnu_add_sparse_entry(a,tar,iVar6,remaining_00), wVar4 != L'\0'))
        goto LAB_00152792;
      }
      tar_flush_unconsumed(a,unconsumed);
      lVar19 = tar->entry_bytes_remaining - remaining;
      request = (ulong)(-(int)lVar19 & 0x1ff);
      if (((long)request <= remaining) &&
         (uVar12 = __archive_read_consume(a,request), request == uVar12)) {
        bytes = request + lVar19;
        if (-1 < bytes) {
          tar->entry_bytes_remaining = tar->entry_bytes_remaining - bytes;
          tar->sparse_gnu_pending = '\0';
          bytes = (ssize_t)(uint)wVar2;
        }
        goto LAB_00151ddb;
      }
    }
LAB_00152792:
    bytes = 0xffffffffffffffe2;
  }
  else {
    pcVar5 = "Unrecognized GNU sparse file format";
    iVar3 = -1;
LAB_00151d8f:
    archive_set_error(&a->archive,iVar3,pcVar5);
    uStack_60 = 0xffffffffffffffec;
    bytes = uStack_60;
  }
  goto LAB_00151ddb;
code_r0x001528da:
  if (tar->sparse_list != (sparse_block *)0x0) {
    tar->entry_offset = tar->sparse_list->offset;
  }
LAB_001528f1:
  bVar20 = true;
LAB_001520bd:
  if (wVar2 != L'\xffffffe2') {
LAB_001520c7:
    tar_flush_unconsumed(a,unconsumed);
    iVar3 = tar->header_recursion_depth + -1;
    tar->header_recursion_depth = iVar3;
    if ((wVar2 == L'\0') || (wVar2 == L'\xffffffec')) goto LAB_001524da;
    goto LAB_00152639;
  }
LAB_00151db4:
  bytes = 0xffffffffffffffe2;
LAB_00151ddb:
  return (wchar_t)bytes;
}

Assistant:

static int
tar_read_header(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, size_t *unconsumed)
{
	ssize_t bytes;
	int err, eof_vol_header;
	const char *h;
	const struct archive_entry_header_ustar *header;
	const struct archive_entry_header_gnutar *gnuheader;

	eof_vol_header = 0;

	/* Loop until we find a workable header record. */
	for (;;) {
		tar_flush_unconsumed(a, unconsumed);

		/* Read 512-byte header record */
		h = __archive_read_ahead(a, 512, &bytes);
		if (bytes < 0)
			return ((int)bytes);
		if (bytes == 0) { /* EOF at a block boundary. */
			/* Some writers do omit the block of nulls. <sigh> */
			return (ARCHIVE_EOF);
		}
		if (bytes < 512) {  /* Short block at EOF; this is bad. */
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated tar archive");
			return (ARCHIVE_FATAL);
		}
		*unconsumed = 512;

		/* Header is workable if it's not an end-of-archive mark. */
		if (h[0] != 0 || !archive_block_is_null(h))
			break;

		/* Ensure format is set for archives with only null blocks. */
		if (a->archive.archive_format_name == NULL) {
			a->archive.archive_format = ARCHIVE_FORMAT_TAR;
			a->archive.archive_format_name = "tar";
		}

		if (!tar->read_concatenated_archives) {
			/* Try to consume a second all-null record, as well. */
			tar_flush_unconsumed(a, unconsumed);
			h = __archive_read_ahead(a, 512, NULL);
			if (h != NULL && h[0] == 0 && archive_block_is_null(h))
				__archive_read_consume(a, 512);
			archive_clear_error(&a->archive);
			return (ARCHIVE_EOF);
		}

		/*
		 * We're reading concatenated archives, ignore this block and
		 * loop to get the next.
		 */
	}

	/*
	 * Note: If the checksum fails and we return ARCHIVE_RETRY,
	 * then the client is likely to just retry.  This is a very
	 * crude way to search for the next valid header!
	 *
	 * TODO: Improve this by implementing a real header scan.
	 */
	if (!checksum(a, h)) {
		tar_flush_unconsumed(a, unconsumed);
		archive_set_error(&a->archive, EINVAL, "Damaged tar archive");
		return (ARCHIVE_RETRY); /* Retryable: Invalid header */
	}

	if (++tar->header_recursion_depth > 32) {
		tar_flush_unconsumed(a, unconsumed);
		archive_set_error(&a->archive, EINVAL, "Too many special headers");
		return (ARCHIVE_WARN);
	}

	/* Determine the format variant. */
	header = (const struct archive_entry_header_ustar *)h;

	switch(header->typeflag[0]) {
	case 'A': /* Solaris tar ACL */
		a->archive.archive_format = ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE;
		a->archive.archive_format_name = "Solaris tar";
		err = header_Solaris_ACL(a, tar, entry, h, unconsumed);
		break;
	case 'g': /* POSIX-standard 'g' header. */
		a->archive.archive_format = ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE;
		a->archive.archive_format_name = "POSIX pax interchange format";
		err = header_pax_global(a, tar, entry, h, unconsumed);
		if (err == ARCHIVE_EOF)
			return (err);
		break;
	case 'K': /* Long link name (GNU tar, others) */
		err = header_longlink(a, tar, entry, h, unconsumed);
		break;
	case 'L': /* Long filename (GNU tar, others) */
		err = header_longname(a, tar, entry, h, unconsumed);
		break;
	case 'V': /* GNU volume header */
		err = header_volume(a, tar, entry, h, unconsumed);
		if (err == ARCHIVE_EOF)
			eof_vol_header = 1;
		break;
	case 'X': /* Used by SUN tar; same as 'x'. */
		a->archive.archive_format = ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE;
		a->archive.archive_format_name =
		    "POSIX pax interchange format (Sun variant)";
		err = header_pax_extensions(a, tar, entry, h, unconsumed);
		break;
	case 'x': /* POSIX-standard 'x' header. */
		a->archive.archive_format = ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE;
		a->archive.archive_format_name = "POSIX pax interchange format";
		err = header_pax_extensions(a, tar, entry, h, unconsumed);
		break;
	default:
		gnuheader = (const struct archive_entry_header_gnutar *)h;
		if (memcmp(gnuheader->magic, "ustar  \0", 8) == 0) {
			a->archive.archive_format = ARCHIVE_FORMAT_TAR_GNUTAR;
			a->archive.archive_format_name = "GNU tar format";
			err = header_gnutar(a, tar, entry, h, unconsumed);
		} else if (memcmp(header->magic, "ustar", 5) == 0) {
			if (a->archive.archive_format != ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE) {
				a->archive.archive_format = ARCHIVE_FORMAT_TAR_USTAR;
				a->archive.archive_format_name = "POSIX ustar format";
			}
			err = header_ustar(a, tar, entry, h);
		} else {
			a->archive.archive_format = ARCHIVE_FORMAT_TAR;
			a->archive.archive_format_name = "tar (non-POSIX)";
			err = header_old_tar(a, tar, entry, h);
		}
	}
	if (err == ARCHIVE_FATAL)
		return (err);

	tar_flush_unconsumed(a, unconsumed);

	h = NULL;
	header = NULL;

	--tar->header_recursion_depth;
	/* Yuck.  Apple's design here ends up storing long pathname
	 * extensions for both the AppleDouble extension entry and the
	 * regular entry.
	 */
	if ((err == ARCHIVE_WARN || err == ARCHIVE_OK) &&
	    tar->header_recursion_depth == 0 &&
	    tar->process_mac_extensions) {
		int err2 = read_mac_metadata_blob(a, tar, entry, h, unconsumed);
		if (err2 < err)
			err = err2;
	}

	/* We return warnings or success as-is.  Anything else is fatal. */
	if (err == ARCHIVE_WARN || err == ARCHIVE_OK) {
		if (tar->sparse_gnu_pending) {
			if (tar->sparse_gnu_major == 1 &&
			    tar->sparse_gnu_minor == 0) {
				ssize_t bytes_read;

				tar->sparse_gnu_pending = 0;
				/* Read initial sparse map. */
				bytes_read = gnu_sparse_10_read(a, tar, unconsumed);
				if (bytes_read < 0)
					return ((int)bytes_read);
				tar->entry_bytes_remaining -= bytes_read;
			} else {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Unrecognized GNU sparse file format");
				return (ARCHIVE_WARN);
			}
			tar->sparse_gnu_pending = 0;
		}
		return (err);
	}
	if (err == ARCHIVE_EOF) {
		if (!eof_vol_header) {
			/* EOF when recursively reading a header is bad. */
			archive_set_error(&a->archive, EINVAL,
			    "Damaged tar archive");
		} else {
			/* If we encounter just a GNU volume header treat
			 * this situation as an empty archive */
			return (ARCHIVE_EOF);
		}
	}
	return (ARCHIVE_FATAL);
}